

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::UpdateActiveFunctionsForOneDataSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,FunctionCodeGenRuntimeData *parentData
          ,Type *dataSet,uint count)

{
  FunctionBody *this_00;
  ulong uVar1;
  FunctionCodeGenRuntimeData *this_01;
  
  if (count != 0) {
    uVar1 = 0;
    do {
      for (this_01 = dataSet[uVar1].ptr; this_01 != (FunctionCodeGenRuntimeData *)0x0;
          this_01 = (this_01->next).ptr) {
        if (this_01 != parentData) {
          this_00 = FunctionCodeGenRuntimeData::GetFunctionBody(this_01);
          UpdateActiveFunctionSet(this_00,pActiveFuncs,this_01);
        }
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != count);
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionsForOneDataSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *parentData, Field(FunctionCodeGenRuntimeData*)* dataSet, uint count) const
    {
        FunctionCodeGenRuntimeData *inlineeData;
        for (uint i = 0; i < count; i++)
        {
            for (inlineeData = dataSet[i]; inlineeData; inlineeData = inlineeData->GetNext())
            {
                // inlineeData == parentData indicates a cycle in the structure. We've already processed parentData, so don't descend.
                if (inlineeData != parentData)
                {
                    inlineeData->GetFunctionBody()->UpdateActiveFunctionSet(pActiveFuncs, inlineeData);
                }
            }
        }
    }